

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

void jsgf_rhs_free(jsgf_rhs_t *rhs)

{
  glist_t pgVar1;
  jsgf_rhs_t *pjVar2;
  
  if (rhs != (jsgf_rhs_t *)0x0) {
    jsgf_rhs_free(rhs->alt);
    pjVar2 = rhs;
    while (pgVar1 = pjVar2->atoms, pgVar1 != (glist_t)0x0) {
      jsgf_atom_free((jsgf_atom_t *)(pgVar1->data).ptr);
      pjVar2 = (jsgf_rhs_t *)&pgVar1->next;
    }
    glist_free(rhs->atoms);
    ckd_free(rhs);
    return;
  }
  return;
}

Assistant:

static void
jsgf_rhs_free(jsgf_rhs_t * rhs)
{
    gnode_t *gn;

    if (rhs == NULL)
        return;

    jsgf_rhs_free(rhs->alt);
    for (gn = rhs->atoms; gn; gn = gnode_next(gn))
        jsgf_atom_free(gnode_ptr(gn));
    glist_free(rhs->atoms);
    ckd_free(rhs);
}